

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O3

void cleanup_object(void)

{
  object_kind *poVar1;
  long lVar2;
  ulong uVar3;
  
  if (z_info->k_max != 0) {
    lVar2 = 0x260;
    uVar3 = 0;
    do {
      poVar1 = k_info;
      string_free(*(char **)((long)k_info + lVar2 + -0x260));
      string_free(*(char **)((long)poVar1 + lVar2 + -600));
      if (uVar3 < z_info->ordinary_kind_max) {
        string_free(*(char **)((long)poVar1 + lVar2 + -8));
      }
      string_free(*(char **)(poVar1->flags + lVar2 + -0x80));
      mem_free(*(void **)((long)poVar1 + lVar2 + -0x50));
      mem_free(*(void **)((long)poVar1 + lVar2 + -0x48));
      mem_free(*(void **)((long)poVar1 + lVar2 + -0x40));
      if (uVar3 < z_info->ordinary_kind_max) {
        free_effect(*(effect **)((long)poVar1 + lVar2 + -0x18));
      }
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x2c0;
    } while (uVar3 < z_info->k_max);
  }
  mem_free(k_info);
  return;
}

Assistant:

static void cleanup_object(void)
{
	int idx;
	for (idx = 0; idx < z_info->k_max; idx++) {
		struct object_kind *kind = &k_info[idx];
		string_free(kind->name);
		string_free(kind->text);
		if (idx < z_info->ordinary_kind_max) {
			string_free(kind->effect_msg);
		}
		string_free(kind->vis_msg);
		mem_free(kind->brands);
		mem_free(kind->slays);
		mem_free(kind->curses);
		if (idx < z_info->ordinary_kind_max) {
			free_effect(kind->effect);
		}
	}
	mem_free(k_info);
}